

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QtPrivate::QCalendarModel::QCalendarModel(QCalendarModel *this,QObject *parent)

{
  int iVar1;
  DayOfWeek DVar2;
  qint64 qVar3;
  long lVar4;
  long in_FS_OFFSET;
  QLocale local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractTableModel::QAbstractTableModel(&this->super_QAbstractTableModel,parent);
  *(undefined ***)this = &PTR_metaObject_007ee5a0;
  this->m_firstColumn = 1;
  this->m_firstRow = 1;
  QCalendar::QCalendar(&this->m_calendar);
  qVar3 = QDate::currentDate();
  (this->m_date).jd = qVar3;
  (this->m_minimumDate).jd = 1;
  QDate::QDate(&this->m_maximumDate,9999,0xc,0x1f);
  iVar1 = QDate::year(&this->m_date,*(undefined8 *)&this->m_calendar);
  this->m_shownYear = iVar1;
  iVar1 = QDate::month(&this->m_date,*(undefined8 *)&this->m_calendar);
  this->m_shownMonth = iVar1;
  QLocale::QLocale(&local_30);
  DVar2 = QLocale::firstDayOfWeek();
  QLocale::~QLocale(&local_30);
  this->m_firstDay = DVar2;
  this->m_horizontalHeaderFormat = ShortDayNames;
  this->m_weekNumbersShown = true;
  lVar4 = 0;
  (this->m_dayFormats).contained[0] = false;
  (this->m_dayFormats).contained[1] = false;
  (this->m_dayFormats).contained[2] = false;
  (this->m_dayFormats).contained[3] = false;
  (this->m_dayFormats).contained[3] = false;
  (this->m_dayFormats).contained[4] = false;
  (this->m_dayFormats).contained[5] = false;
  (this->m_dayFormats).contained[6] = false;
  do {
    QTextCharFormat::QTextCharFormat
              ((QTextCharFormat *)(&(this->m_dayFormats).data[0].super_QTextFormat + lVar4));
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x70);
  (this->m_dateFormats).d.d.ptr =
       (QMapData<std::map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>_>
        *)0x0;
  QTextCharFormat::QTextCharFormat(&this->m_headerFormat);
  this->m_view = (QCalendarView *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCalendarModel::QCalendarModel(QObject *parent)
    : QAbstractTableModel(parent),
      m_firstColumn(1),
      m_firstRow(1),
      m_date(QDate::currentDate()),
      m_minimumDate(QDate::fromJulianDay(1)),
      m_maximumDate(9999, 12, 31),
      m_shownYear(m_date.year(m_calendar)),
      m_shownMonth(m_date.month(m_calendar)),
      m_firstDay(QLocale().firstDayOfWeek()),
      m_horizontalHeaderFormat(QCalendarWidget::ShortDayNames),
      m_weekNumbersShown(true),
      m_view(nullptr)
{
}